

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

AppleAcceleratorTable *
getAccelTable<llvm::AppleAcceleratorTable>
          (unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
           *Cache,DWARFObject *Obj,DWARFSection *Section,StringRef StringSection,bool IsLittleEndian
          )

{
  char *pcVar1;
  size_t sVar2;
  undefined1 auVar3 [8];
  AppleAcceleratorTable *pAVar4;
  ulong uVar5;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Error local_48;
  undefined1 local_40 [8];
  Error E;
  
  pAVar4 = (Cache->_M_t).
           super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
           .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl;
  if (pAVar4 == (AppleAcceleratorTable *)0x0) {
    pcVar1 = (Section->Data).Data;
    sVar2 = (Section->Data).Length;
    pAVar4 = (AppleAcceleratorTable *)operator_new(0x90);
    local_68 = SUB84(pcVar1,0);
    uStack_64 = (undefined4)((ulong)pcVar1 >> 0x20);
    uStack_60 = (undefined4)sVar2;
    uStack_5c = (undefined4)(sVar2 >> 0x20);
    *(undefined4 *)&(pAVar4->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.Data =
         local_68;
    *(undefined4 *)((long)&(pAVar4->super_DWARFAcceleratorTable).AccelSection + 4) = uStack_64;
    *(undefined4 *)((long)&(pAVar4->super_DWARFAcceleratorTable).AccelSection + 8) = uStack_60;
    *(undefined4 *)((long)&(pAVar4->super_DWARFAcceleratorTable).AccelSection + 0xc) = uStack_5c;
    *(bool *)((long)&(pAVar4->super_DWARFAcceleratorTable).AccelSection + 0x10) = IsLittleEndian;
    *(uint8_t *)((long)&(pAVar4->super_DWARFAcceleratorTable).AccelSection + 0x11) = '\0';
    *(DWARFObject **)((long)&(pAVar4->super_DWARFAcceleratorTable).AccelSection + 0x18) = Obj;
    *(DWARFSection **)((long)&(pAVar4->super_DWARFAcceleratorTable).AccelSection + 0x20) = Section;
    (pAVar4->super_DWARFAcceleratorTable).StringSection.Data.Data = StringSection.Data;
    *(size_t *)((long)&(pAVar4->super_DWARFAcceleratorTable).StringSection + 8) =
         StringSection.Length;
    *(bool *)((long)&(pAVar4->super_DWARFAcceleratorTable).StringSection + 0x10) = IsLittleEndian;
    *(uint8_t *)((long)&(pAVar4->super_DWARFAcceleratorTable).StringSection + 0x11) = '\0';
    (pAVar4->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable =
         (_func_int **)&PTR__AppleAcceleratorTable_00d77728;
    *(SmallVectorStorage<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U> **)
     &(pAVar4->HdrData).Atoms.super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
      super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> =
         (SmallVectorStorage<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U> *)
         ((long)&(pAVar4->HdrData).Atoms + 0x10);
    *(undefined8 *)((long)&(pAVar4->HdrData).Atoms + 8) = 0x300000000;
    pAVar4->IsValid = false;
    (Cache->_M_t).
    super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
    .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl = pAVar4;
    llvm::AppleAcceleratorTable::extract((AppleAcceleratorTable *)local_40);
    uVar5 = (ulong)local_40 & 0xfffffffffffffffe;
    auVar3 = (undefined1  [8])(uVar5 != 0 | uVar5);
    if (uVar5 != 0) {
      local_48.Payload = (ErrorInfoBase *)((ulong)local_40 | 1);
      local_40 = (undefined1  [8])0x0;
      llvm::handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
                (&local_48,(anon_class_1_0_00000001 *)((long)&E.Payload + 7));
      auVar3 = local_40;
      if ((long *)((ulong)local_48.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_48.Payload & 0xfffffffffffffffe) + 8))();
        auVar3 = local_40;
      }
    }
    local_40 = auVar3;
    if ((long *)((ulong)local_40 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_40 & 0xfffffffffffffffe) + 8))();
    }
    pAVar4 = (Cache->_M_t).
             super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
             .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl;
  }
  return pAVar4;
}

Assistant:

static T &getAccelTable(std::unique_ptr<T> &Cache, const DWARFObject &Obj,
                        const DWARFSection &Section, StringRef StringSection,
                        bool IsLittleEndian) {
  if (Cache)
    return *Cache;
  DWARFDataExtractor AccelSection(Obj, Section, IsLittleEndian, 0);
  DataExtractor StrData(StringSection, IsLittleEndian, 0);
  Cache.reset(new T(AccelSection, StrData));
  if (Error E = Cache->extract())
    llvm::consumeError(std::move(E));
  return *Cache;
}